

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O2

bool __thiscall double_conversion::Bignum::ToHexString(Bignum *this,char *buffer,int buffer_size)

{
  int i;
  uint uVar1;
  int iVar2;
  int iVar3;
  char cVar4;
  int i_1;
  char *pcVar5;
  long lVar6;
  Chunk CVar7;
  long lVar8;
  
  i = (int)this->used_bigits_;
  if (this->used_bigits_ == 0) {
    if (1 < buffer_size) {
      buffer[0] = '0';
      buffer[1] = '\0';
      return true;
    }
  }
  else {
    iVar2 = (this->exponent_ + i) * 7;
    iVar3 = iVar2 + -8;
    pcVar5 = buffer + (long)iVar2 + -7;
    for (uVar1 = this->bigits_buffer_[(long)i + -1]; uVar1 != 0; uVar1 = uVar1 >> 4) {
      iVar3 = iVar3 + 1;
      pcVar5 = pcVar5 + 1;
    }
    iVar2 = 0;
    if (iVar3 + 1 < buffer_size) {
      *pcVar5 = '\0';
      for (; iVar2 < this->exponent_; iVar2 = iVar2 + 1) {
        for (lVar6 = 0; (int)lVar6 != -7; lVar6 = lVar6 + -1) {
          buffer[lVar6 + iVar3] = '0';
        }
        iVar3 = iVar3 + -7;
      }
      lVar6 = 0;
      while( true ) {
        if ((long)this->used_bigits_ + -1 <= lVar6) break;
        CVar7 = this->bigits_buffer_[lVar6];
        for (lVar8 = 0; (int)lVar8 != -7; lVar8 = lVar8 + -1) {
          cVar4 = '7';
          if ((CVar7 & 0xf) < 10) {
            cVar4 = '0';
          }
          buffer[lVar8 + iVar3] = cVar4 + (char)(CVar7 & 0xf);
          CVar7 = CVar7 >> 4;
        }
        iVar3 = iVar3 + -7;
        lVar6 = lVar6 + 1;
      }
      pcVar5 = buffer + iVar3;
      for (uVar1 = this->bigits_buffer_[(long)this->used_bigits_ + -1]; uVar1 != 0;
          uVar1 = uVar1 >> 4) {
        cVar4 = '7';
        if ((uVar1 & 0xf) < 10) {
          cVar4 = '0';
        }
        *pcVar5 = cVar4 + (char)(uVar1 & 0xf);
        pcVar5 = pcVar5 + -1;
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool Bignum::ToHexString(char* buffer, const int buffer_size) const {
  DOUBLE_CONVERSION_ASSERT(IsClamped());
  // Each bigit must be printable as separate hex-character.
  DOUBLE_CONVERSION_ASSERT(kBigitSize % 4 == 0);
  static const int kHexCharsPerBigit = kBigitSize / 4;

  if (used_bigits_ == 0) {
    if (buffer_size < 2) {
      return false;
    }
    buffer[0] = '0';
    buffer[1] = '\0';
    return true;
  }
  // We add 1 for the terminating '\0' character.
  const int needed_chars = (BigitLength() - 1) * kHexCharsPerBigit +
    SizeInHexChars(RawBigit(used_bigits_ - 1)) + 1;
  if (needed_chars > buffer_size) {
    return false;
  }
  int string_index = needed_chars - 1;
  buffer[string_index--] = '\0';
  for (int i = 0; i < exponent_; ++i) {
    for (int j = 0; j < kHexCharsPerBigit; ++j) {
      buffer[string_index--] = '0';
    }
  }
  for (int i = 0; i < used_bigits_ - 1; ++i) {
    Chunk current_bigit = RawBigit(i);
    for (int j = 0; j < kHexCharsPerBigit; ++j) {
      buffer[string_index--] = HexCharOfValue(current_bigit & 0xF);
      current_bigit >>= 4;
    }
  }
  // And finally the last bigit.
  Chunk most_significant_bigit = RawBigit(used_bigits_ - 1);
  while (most_significant_bigit != 0) {
    buffer[string_index--] = HexCharOfValue(most_significant_bigit & 0xF);
    most_significant_bigit >>= 4;
  }
  return true;
}